

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verification_utils.hpp
# Opt level: O3

void __thiscall boost::certify::store_ctx::set_server_hostname(store_ctx *this,string_view hostname)

{
  char cVar1;
  int iVar2;
  X509_VERIFY_PARAM *pXVar3;
  ulong uVar4;
  undefined **local_58 [2];
  ulong local_48;
  error_category *local_40;
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  pXVar3 = X509_STORE_CTX_get0_param
                     ((X509_STORE_CTX *)
                      (this->handle_)._M_t.
                      super___uniq_ptr_impl<x509_store_ctx_st,_boost::certify::store_ctx::free>._M_t
                      .super__Tuple_impl<0UL,_x509_store_ctx_st_*,_boost::certify::store_ctx::free>.
                      super__Head_base<0UL,_x509_store_ctx_st_*,_false>._M_head_impl);
  X509_VERIFY_PARAM_set_hostflags(pXVar3,4);
  iVar2 = X509_VERIFY_PARAM_set1_host(pXVar3,hostname.ptr_,hostname.len_);
  if (iVar2 == 0) {
    uVar4 = ERR_get_error();
    if ((DAT_00109250 == -0x4d54ee85da8120f3) || (DAT_00109250 == -0x70502de1da3a1f65)) {
      if ((int)uVar4 != 0) {
LAB_00104041:
        std::runtime_error::runtime_error((runtime_error *)local_58,"");
        local_58[0] = &PTR__system_error_00108a90;
        local_40 = (error_category *)&asio::error::get_ssl_category()::instance;
        local_38._M_p = (pointer)((long)&((system_error *)local_58)->m_what + 0x10);
        local_30 = 0;
        local_28._M_local_buf[0] = '\0';
        local_48 = uVar4 & 0xffffffff | 0x100000000;
        throw_exception<boost::system::system_error>((system_error *)local_58);
      }
    }
    else {
      cVar1 = (**(code **)(asio::error::get_ssl_category()::instance + 0x30))
                        (&asio::error::get_ssl_category()::instance,uVar4 & 0xffffffff);
      if (cVar1 != '\0') goto LAB_00104041;
    }
  }
  return;
}

Assistant:

void set_server_hostname(string_view hostname)
    {
        auto* param = ::X509_STORE_CTX_get0_param(handle_.get());
        system::error_code ec;
        detail::set_server_hostname(param, hostname, ec);
        if (ec)
            boost::throw_exception(system::system_error{ec});
    }